

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression *
slang::ast::Expression::create
          (Compilation *compilation,ExpressionSyntax *syntax,ASTContext *ctx,
          bitmask<slang::ast::ASTFlags> extraFlags,Type *assignmentTarget)

{
  SyntaxKind kind;
  bool bVar1;
  Expression *pEVar2;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  DiagCode code;
  SourceRange sourceRange;
  ASTContext context;
  ASTContext AStack_58;
  
  ASTContext::resetFlags(&AStack_58,ctx,extraFlags);
  kind = (syntax->super_SyntaxNode).kind;
  switch(kind) {
  case UnaryBitwiseAndExpression:
  case UnaryBitwiseNandExpression:
  case UnaryBitwiseNorExpression:
  case UnaryBitwiseNotExpression:
  case UnaryBitwiseOrExpression:
  case UnaryBitwiseXnorExpression:
  case UnaryBitwiseXorExpression:
  case UnaryLogicalNotExpression:
  case UnaryMinusExpression:
  case UnaryPlusExpression:
  case UnaryPredecrementExpression:
  case UnaryPreincrementExpression:
    pEVar2 = UnaryExpression::fromSyntax
                       (compilation,(PrefixUnaryExpressionSyntax *)syntax,&AStack_58);
    break;
  case UnaryConditionalDirectiveExpression:
  case UnaryPropertyExpr:
  case UnarySelectPropertyExpr:
  case UnconnectedDriveDirective:
  case UndefDirective:
  case UndefineAllDirective:
  case UnionType:
  case UniquenessConstraint:
  case UnitScope:
  case UntilPropertyExpr:
  case UntilWithPropertyExpr:
  case Untyped:
  case UserDefinedNetDeclaration:
  case VariableDimension:
  case VariablePattern:
  case VariablePortHeader:
  case VirtualInterfaceType:
  case VoidCastedCallStatement:
  case VoidType:
  case WaitForkStatement:
  case WaitOrderStatement:
  case WaitStatement:
  case WildcardDimensionSpecifier:
switchD_002d6547_caseD_1bd:
    bVar1 = slang::syntax::NameSyntax::isKind(kind);
    if (bVar1) {
      pEVar2 = bindName(compilation,(NameSyntax *)syntax,(InvocationExpressionSyntax *)0x0,
                        (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&AStack_58);
    }
    else {
      slang::syntax::DataTypeSyntax::isKind((syntax->super_SyntaxNode).kind);
      pEVar2 = DataTypeExpression::fromSyntax(compilation,(DataTypeSyntax *)syntax,&AStack_58);
    }
    break;
  case UnbasedUnsizedLiteralExpression:
    pEVar2 = UnbasedUnsizedIntegerLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax)
    ;
    break;
  case ValueRangeExpression:
    pEVar2 = ValueRangeExpression::fromSyntax
                       (compilation,(ValueRangeExpressionSyntax *)syntax,&AStack_58);
    break;
  case WildcardEqualityExpression:
  case WildcardInequalityExpression:
    goto switchD_002d6547_caseD_1c4;
  case WildcardLiteralExpression:
    pEVar2 = UnboundedLiteral::fromSyntax(&AStack_58,(LiteralExpressionSyntax *)syntax);
    break;
  default:
    switch(kind) {
    case InequalityExpression:
    case LessThanEqualExpression:
    case LessThanExpression:
    case LogicalAndExpression:
    case LogicalEquivalenceExpression:
    case LogicalImplicationExpression:
    case LogicalOrExpression:
    case LogicalShiftLeftExpression:
    case LogicalShiftRightExpression:
      goto switchD_002d6547_caseD_1c4;
    case InitialBlock:
    case InstanceConfigRule:
    case InstanceName:
    case IntType:
    case IntegerType:
    case InterfaceDeclaration:
    case InterfaceHeader:
    case InterfacePortHeader:
    case IntersectClause:
    case IntersectSequenceExpr:
    case JumpStatement:
    case LetDeclaration:
    case LibraryDeclaration:
    case LibraryIncDirClause:
    case LibraryIncludeStatement:
    case LibraryMap:
    case LineDirective:
    case LocalScope:
    case LocalVariableDeclaration:
    case LogicType:
      goto switchD_002d6547_caseD_1bd;
    case InsideExpression:
      pEVar2 = InsideExpression::fromSyntax(compilation,(InsideExpressionSyntax *)syntax,&AStack_58)
      ;
      break;
    case IntegerLiteralExpression:
      pEVar2 = IntegerLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax);
      break;
    case IntegerVectorExpression:
      pEVar2 = IntegerLiteral::fromSyntax(compilation,(IntegerVectorExpressionSyntax *)syntax);
      break;
    case InvocationExpression:
      pEVar2 = CallExpression::fromSyntax
                         (compilation,(InvocationExpressionSyntax *)syntax,
                          (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&AStack_58);
      if (pEVar2->syntax != (ExpressionSyntax *)0x0) {
        return pEVar2;
      }
      break;
    case LogicalLeftShiftAssignmentExpression:
    case LogicalRightShiftAssignmentExpression:
switchD_002d6547_caseD_1c3:
      pEVar2 = AssignmentExpression::fromSyntax
                         (compilation,(BinaryExpressionSyntax *)syntax,&AStack_58);
      break;
    default:
      switch(kind) {
      case AssignmentExpression:
        goto switchD_002d6547_caseD_1c3;
      case AssignmentPatternExpression:
        pEVar2 = bindAssignmentPattern
                           (compilation,(AssignmentPatternExpressionSyntax *)syntax,&AStack_58,
                            assignmentTarget);
        goto LAB_002d6577;
      case AssignmentPatternItem:
      case AssumePropertyStatement:
      case AttributeInstance:
      case AttributeSpec:
      case BeginKeywordsDirective:
      case BinSelectWithFilterExpr:
      case BinaryBinsSelectExpr:
      case BinaryBlockEventExpression:
      case BinaryConditionalDirectiveExpression:
      case BinaryEventExpression:
        goto switchD_002d6547_caseD_1bd;
      case BadExpression:
switchD_002d64da_caseD_26:
        pEVar2 = badExpr(compilation,(Expression *)0x0);
        goto LAB_002d6577;
      case BinaryAndExpression:
      case BinaryOrExpression:
      case BinaryXnorExpression:
      case BinaryXorExpression:
        goto switchD_002d6547_caseD_1c4;
      }
      switch(kind) {
      case MemberAccessExpression:
        pEVar2 = MemberAccessExpression::fromSyntax
                           (compilation,(MemberAccessExpressionSyntax *)syntax,
                            (InvocationExpressionSyntax *)0x0,
                            (ArrayOrRandomizeMethodExpressionSyntax *)0x0,&AStack_58);
        break;
      case MinTypMaxExpression:
        pEVar2 = MinTypMaxExpression::fromSyntax
                           (compilation,(MinTypMaxExpressionSyntax *)syntax,&AStack_58,
                            assignmentTarget);
        break;
      case ModAssignmentExpression:
      case MultiplyAssignmentExpression:
        goto switchD_002d6547_caseD_1c3;
      case ModExpression:
      case MultiplyExpression:
        goto switchD_002d6547_caseD_1c4;
      case ModportClockingPort:
      case ModportDeclaration:
      case ModportExplicitPort:
      case ModportItem:
      case ModportNamedPort:
      case ModportSimplePortList:
      case ModportSubroutinePort:
      case ModportSubroutinePortList:
      case ModuleDeclaration:
      case ModuleHeader:
        goto switchD_002d6547_caseD_1bd;
      case MultipleConcatenationExpression:
        pEVar2 = ReplicationExpression::fromSyntax
                           (compilation,(MultipleConcatenationExpressionSyntax *)syntax,&AStack_58);
        break;
      default:
        switch(kind) {
        case NewArrayExpression:
          pEVar2 = NewArrayExpression::fromSyntax
                             (compilation,(NewArrayExpressionSyntax *)syntax,&AStack_58,
                              assignmentTarget);
          break;
        case NewClassExpression:
          pEVar2 = NewClassExpression::fromSyntax
                             (compilation,(NewClassExpressionSyntax *)syntax,&AStack_58,
                              assignmentTarget);
          break;
        case NoUnconnectedDriveDirective:
        case NonAnsiPortList:
        case NonAnsiUdpPortList:
        case NonblockingEventTriggerStatement:
        case NumberPragmaExpression:
        case OneStepDelay:
          goto switchD_002d6547_caseD_1bd;
        case NonblockingAssignmentExpression:
        case OrAssignmentExpression:
          goto switchD_002d6547_caseD_1c3;
        case NullLiteralExpression:
          pEVar2 = NullLiteral::fromSyntax(compilation,(LiteralExpressionSyntax *)syntax);
          break;
        default:
          switch(kind) {
          case StreamingConcatenationExpression:
            pEVar2 = StreamingConcatenationExpression::fromSyntax
                               (compilation,(StreamingConcatenationExpressionSyntax *)syntax,
                                &AStack_58);
            break;
          case StringLiteralExpression:
            pEVar2 = StringLiteral::fromSyntax(&AStack_58,(LiteralExpressionSyntax *)syntax);
            break;
          case StringType:
          case StrongWeakPropertyExpr:
          case StructType:
          case StructUnionMember:
          case StructurePattern:
          case StructuredAssignmentPattern:
          case SuperHandle:
            goto switchD_002d6547_caseD_1bd;
          case SubtractAssignmentExpression:
            goto switchD_002d6547_caseD_1c3;
          case SuperNewDefaultedArgsExpression:
            pEVar2 = NewClassExpression::fromSyntax
                               (compilation,(SuperNewDefaultedArgsExpressionSyntax *)syntax,
                                &AStack_58,assignmentTarget);
            break;
          default:
            if (kind - ArithmeticLeftShiftAssignmentExpression < 2) goto switchD_002d6547_caseD_1c3;
            if ((1 < kind - ArithmeticShiftLeftExpression) &&
               (1 < kind - GreaterThanEqualExpression)) {
              if (kind - PostdecrementExpression < 2) {
                pEVar2 = UnaryExpression::fromSyntax
                                   (compilation,(PostfixUnaryExpressionSyntax *)syntax,&AStack_58);
                break;
              }
              if (kind == AddAssignmentExpression) goto switchD_002d6547_caseD_1c3;
              if (kind != AddExpression) {
                if (kind == AndAssignmentExpression) goto switchD_002d6547_caseD_1c3;
                if (kind == ArrayOrRandomizeMethodExpression) {
                  pEVar2 = CallExpression::fromSyntax
                                     (compilation,(ArrayOrRandomizeMethodExpressionSyntax *)syntax,
                                      &AStack_58);
                  break;
                }
                if ((kind != CaseEqualityExpression) && (kind != CaseInequalityExpression)) {
                  if (kind == CastExpression) {
                    pEVar2 = ConversionExpression::fromSyntax
                                       (compilation,(CastExpressionSyntax *)syntax,&AStack_58,
                                        assignmentTarget);
                    break;
                  }
                  if (kind == ConcatenationExpression) {
                    pEVar2 = ConcatenationExpression::fromSyntax
                                       (compilation,(ConcatenationExpressionSyntax *)syntax,
                                        &AStack_58,assignmentTarget);
                    break;
                  }
                  if (kind == ConditionalExpression) {
                    pEVar2 = ConditionalExpression::fromSyntax
                                       (compilation,(ConditionalExpressionSyntax *)syntax,&AStack_58
                                        ,assignmentTarget);
                    break;
                  }
                  if (kind == CopyClassExpression) {
                    pEVar2 = CopyClassExpression::fromSyntax
                                       (compilation,(CopyClassExpressionSyntax *)syntax,&AStack_58);
                    break;
                  }
                  if (kind == DefaultPatternKeyExpression) {
                    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
                    code.subsystem = General;
                    code.code = 1;
LAB_002d66fd:
                    ASTContext::addDiag(&AStack_58,code,sourceRange);
                    goto switchD_002d64da_caseD_26;
                  }
                  if (kind == DivideAssignmentExpression) goto switchD_002d6547_caseD_1c3;
                  if (kind != DivideExpression) {
                    if (kind == ElementSelectExpression) {
                      pEVar2 = bindSelectExpression
                                         (compilation,(ElementSelectExpressionSyntax *)syntax,
                                          &AStack_58);
                      break;
                    }
                    if (kind == EmptyQueueExpression) {
                      pEVar2 = ConcatenationExpression::fromEmpty
                                         (compilation,(EmptyQueueExpressionSyntax *)syntax,
                                          &AStack_58,assignmentTarget);
                      break;
                    }
                    if (kind != EqualityExpression) {
                      if (kind == ExpressionOrDist) {
                        pEVar2 = DistExpression::fromSyntax
                                           (compilation,(ExpressionOrDistSyntax *)syntax,&AStack_58)
                        ;
                        break;
                      }
                      if (kind == ParenthesizedExpression) {
                        extraFlags_00.m_bits = extraFlags.m_bits | 8;
                        if (((byte)AStack_58.flags.m_bits & 0x30) != 0) {
                          extraFlags_00.m_bits = extraFlags.m_bits;
                        }
                        pEVar2 = create(compilation,
                                        (ExpressionSyntax *)syntax[1].super_SyntaxNode.previewNode,
                                        &AStack_58,extraFlags_00,assignmentTarget);
                        break;
                      }
                      if (kind != PowerExpression) {
                        if (kind == RealLiteralExpression) {
                          pEVar2 = RealLiteral::fromSyntax
                                             (compilation,(LiteralExpressionSyntax *)syntax);
                          break;
                        }
                        if (kind == SignedCastExpression) {
                          pEVar2 = ConversionExpression::fromSyntax
                                             (compilation,(SignedCastExpressionSyntax *)syntax,
                                              &AStack_58);
                          break;
                        }
                        if (kind == TaggedUnionExpression) {
                          pEVar2 = TaggedUnionExpression::fromSyntax
                                             (compilation,(TaggedUnionExpressionSyntax *)syntax,
                                              &AStack_58,assignmentTarget);
                          break;
                        }
                        if (kind == TimeLiteralExpression) {
                          pEVar2 = TimeLiteral::fromSyntax
                                             (&AStack_58,(LiteralExpressionSyntax *)syntax);
                          break;
                        }
                        if (kind == TimingControlExpression) {
                          sourceRange = slang::syntax::SyntaxNode::sourceRange
                                                  (&syntax->super_SyntaxNode);
                          code.subsystem = Expressions;
                          code.code = 0x9e;
                          goto LAB_002d66fd;
                        }
                        if (kind != XorAssignmentExpression) goto switchD_002d6547_caseD_1bd;
                        goto switchD_002d6547_caseD_1c3;
                      }
                    }
                  }
                }
              }
            }
          case SubtractExpression:
switchD_002d6547_caseD_1c4:
            pEVar2 = BinaryExpression::fromSyntax
                               (compilation,(BinaryExpressionSyntax *)syntax,&AStack_58);
          }
        }
      }
    }
  }
LAB_002d6577:
  pEVar2->syntax = syntax;
  return pEVar2;
}

Assistant:

Expression& Expression::create(Compilation& compilation, const ExpressionSyntax& syntax,
                               const ASTContext& ctx, bitmask<ASTFlags> extraFlags,
                               const Type* assignmentTarget) {
    ASTContext context = ctx.resetFlags(extraFlags);
    Expression* result;
    switch (syntax.kind) {
        case SyntaxKind::BadExpression:
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NullLiteralExpression:
            result = &NullLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::WildcardLiteralExpression:
            result = &UnboundedLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::StringLiteralExpression:
            result = &StringLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::RealLiteralExpression:
            result = &RealLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::TimeLiteralExpression:
            result = &TimeLiteral::fromSyntax(context, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerLiteralExpression:
            result = &IntegerLiteral::fromSyntax(compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
            result = &UnbasedUnsizedIntegerLiteral::fromSyntax(
                compilation, syntax.as<LiteralExpressionSyntax>());
            break;
        case SyntaxKind::IntegerVectorExpression:
            result = &IntegerLiteral::fromSyntax(compilation,
                                                 syntax.as<IntegerVectorExpressionSyntax>());
            break;
        case SyntaxKind::ParenthesizedExpression:
            // Parenthesis re-allows assignments if we're in a procedural statement.
            if (!context.flags.has(ASTFlags::NonProcedural) &&
                !context.flags.has(ASTFlags::AssignmentDisallowed)) {
                extraFlags |= ASTFlags::AssignmentAllowed;
            }

            result = &create(compilation, *syntax.as<ParenthesizedExpressionSyntax>().expression,
                             context, extraFlags, assignmentTarget);
            break;
        case SyntaxKind::UnaryPlusExpression:
        case SyntaxKind::UnaryMinusExpression:
        case SyntaxKind::UnaryBitwiseNotExpression:
        case SyntaxKind::UnaryBitwiseAndExpression:
        case SyntaxKind::UnaryBitwiseOrExpression:
        case SyntaxKind::UnaryBitwiseXorExpression:
        case SyntaxKind::UnaryBitwiseNandExpression:
        case SyntaxKind::UnaryBitwiseNorExpression:
        case SyntaxKind::UnaryBitwiseXnorExpression:
        case SyntaxKind::UnaryLogicalNotExpression:
        case SyntaxKind::UnaryPreincrementExpression:
        case SyntaxKind::UnaryPredecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PrefixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::PostincrementExpression:
        case SyntaxKind::PostdecrementExpression:
            result = &UnaryExpression::fromSyntax(compilation,
                                                  syntax.as<PostfixUnaryExpressionSyntax>(),
                                                  context);
            break;
        case SyntaxKind::AddExpression:
        case SyntaxKind::SubtractExpression:
        case SyntaxKind::MultiplyExpression:
        case SyntaxKind::DivideExpression:
        case SyntaxKind::ModExpression:
        case SyntaxKind::BinaryAndExpression:
        case SyntaxKind::BinaryOrExpression:
        case SyntaxKind::BinaryXorExpression:
        case SyntaxKind::BinaryXnorExpression:
        case SyntaxKind::EqualityExpression:
        case SyntaxKind::InequalityExpression:
        case SyntaxKind::CaseEqualityExpression:
        case SyntaxKind::CaseInequalityExpression:
        case SyntaxKind::GreaterThanEqualExpression:
        case SyntaxKind::GreaterThanExpression:
        case SyntaxKind::LessThanEqualExpression:
        case SyntaxKind::LessThanExpression:
        case SyntaxKind::WildcardEqualityExpression:
        case SyntaxKind::WildcardInequalityExpression:
        case SyntaxKind::LogicalAndExpression:
        case SyntaxKind::LogicalOrExpression:
        case SyntaxKind::LogicalImplicationExpression:
        case SyntaxKind::LogicalEquivalenceExpression:
        case SyntaxKind::LogicalShiftLeftExpression:
        case SyntaxKind::LogicalShiftRightExpression:
        case SyntaxKind::ArithmeticShiftLeftExpression:
        case SyntaxKind::ArithmeticShiftRightExpression:
        case SyntaxKind::PowerExpression:
            result = &BinaryExpression::fromSyntax(compilation, syntax.as<BinaryExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::AssignmentExpression:
        case SyntaxKind::AddAssignmentExpression:
        case SyntaxKind::SubtractAssignmentExpression:
        case SyntaxKind::MultiplyAssignmentExpression:
        case SyntaxKind::DivideAssignmentExpression:
        case SyntaxKind::ModAssignmentExpression:
        case SyntaxKind::AndAssignmentExpression:
        case SyntaxKind::OrAssignmentExpression:
        case SyntaxKind::XorAssignmentExpression:
        case SyntaxKind::LogicalLeftShiftAssignmentExpression:
        case SyntaxKind::LogicalRightShiftAssignmentExpression:
        case SyntaxKind::ArithmeticLeftShiftAssignmentExpression:
        case SyntaxKind::ArithmeticRightShiftAssignmentExpression:
        case SyntaxKind::NonblockingAssignmentExpression:
            result = &AssignmentExpression::fromSyntax(compilation,
                                                       syntax.as<BinaryExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::InvocationExpression:
            result = &CallExpression::fromSyntax(compilation,
                                                 syntax.as<InvocationExpressionSyntax>(), nullptr,
                                                 context);

            // The syntax node might have already been assigned after creating the
            // call expression, for cases like let decls that get expanded in place.
            // Return early to avoid overwriting that syntax node.
            if (result->syntax)
                return *result;
            break;
        case SyntaxKind::ConditionalExpression:
            result = &ConditionalExpression::fromSyntax(compilation,
                                                        syntax.as<ConditionalExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        case SyntaxKind::InsideExpression:
            result = &InsideExpression::fromSyntax(compilation, syntax.as<InsideExpressionSyntax>(),
                                                   context);
            break;
        case SyntaxKind::MemberAccessExpression:
            result = &MemberAccessExpression::fromSyntax(compilation,
                                                         syntax.as<MemberAccessExpressionSyntax>(),
                                                         nullptr, nullptr, context);
            break;
        case SyntaxKind::ConcatenationExpression:
            result = &ConcatenationExpression::fromSyntax(
                compilation, syntax.as<ConcatenationExpressionSyntax>(), context, assignmentTarget);
            break;
        case SyntaxKind::EmptyQueueExpression:
            result = &ConcatenationExpression::fromEmpty(compilation,
                                                         syntax.as<EmptyQueueExpressionSyntax>(),
                                                         context, assignmentTarget);
            break;
        case SyntaxKind::MultipleConcatenationExpression:
            result = &ReplicationExpression::fromSyntax(
                compilation, syntax.as<MultipleConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::StreamingConcatenationExpression:
            result = &StreamingConcatenationExpression::fromSyntax(
                compilation, syntax.as<StreamingConcatenationExpressionSyntax>(), context);
            break;
        case SyntaxKind::ElementSelectExpression:
            result = &bindSelectExpression(compilation, syntax.as<ElementSelectExpressionSyntax>(),
                                           context);
            break;
        case SyntaxKind::CastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<CastExpressionSyntax>(), context,
                                                       assignmentTarget);
            break;
        case SyntaxKind::SignedCastExpression:
            result = &ConversionExpression::fromSyntax(compilation,
                                                       syntax.as<SignedCastExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::AssignmentPatternExpression:
            result = &bindAssignmentPattern(compilation,
                                            syntax.as<AssignmentPatternExpressionSyntax>(), context,
                                            assignmentTarget);
            break;
        case SyntaxKind::ValueRangeExpression:
            result = &ValueRangeExpression::fromSyntax(compilation,
                                                       syntax.as<ValueRangeExpressionSyntax>(),
                                                       context);
            break;
        case SyntaxKind::ExpressionOrDist:
            result = &DistExpression::fromSyntax(compilation, syntax.as<ExpressionOrDistSyntax>(),
                                                 context);
            break;
        case SyntaxKind::TimingControlExpression:
            // Valid cases of this expression type are handled in AssignmentExpression.
            // If we reach this block here, the expression is invalid so always report
            // an error.
            context.addDiag(diag::TimingControlNotAllowed, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::NewArrayExpression:
            result = &NewArrayExpression::fromSyntax(compilation,
                                                     syntax.as<NewArrayExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::NewClassExpression:
            result = &NewClassExpression::fromSyntax(compilation,
                                                     syntax.as<NewClassExpressionSyntax>(), context,
                                                     assignmentTarget);
            break;
        case SyntaxKind::SuperNewDefaultedArgsExpression:
            result = &NewClassExpression::fromSyntax(
                compilation, syntax.as<SuperNewDefaultedArgsExpressionSyntax>(), context,
                assignmentTarget);
            break;
        case SyntaxKind::CopyClassExpression:
            result = &CopyClassExpression::fromSyntax(compilation,
                                                      syntax.as<CopyClassExpressionSyntax>(),
                                                      context);
            break;
        case SyntaxKind::DefaultPatternKeyExpression:
            // This should not be reachable from any valid expression creation.
            context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
            result = &badExpr(compilation, nullptr);
            break;
        case SyntaxKind::MinTypMaxExpression:
            result = &MinTypMaxExpression::fromSyntax(compilation,
                                                      syntax.as<MinTypMaxExpressionSyntax>(),
                                                      context, assignmentTarget);
            break;
        case SyntaxKind::ArrayOrRandomizeMethodExpression:
            result = &CallExpression::fromSyntax(
                compilation, syntax.as<ArrayOrRandomizeMethodExpressionSyntax>(), context);
            break;
        case SyntaxKind::TaggedUnionExpression:
            result = &TaggedUnionExpression::fromSyntax(compilation,
                                                        syntax.as<TaggedUnionExpressionSyntax>(),
                                                        context, assignmentTarget);
            break;
        default:
            if (NameSyntax::isKind(syntax.kind)) {
                result = &bindName(compilation, syntax.as<NameSyntax>(), nullptr, nullptr, context);
                break;
            }
            else if (DataTypeSyntax::isKind(syntax.kind)) {
                result = &DataTypeExpression::fromSyntax(compilation, syntax.as<DataTypeSyntax>(),
                                                         context);
                break;
            }
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}